

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool __thiscall
bssl::anon_unknown_0::DecodeLowerHex
          (anon_unknown_0 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          Span<const_char> in)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  size_t sVar4;
  size_type sVar5;
  char *pcVar6;
  byte *pbVar7;
  byte local_33;
  uint8_t b;
  char lo;
  ulong uStack_30;
  char hi;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  Span<const_char> in_local;
  
  in_local.data_ = in.data_;
  out_local = out;
  sVar4 = Span<const_char>::size((Span<const_char> *)&out_local);
  if ((sVar4 & 1) == 0) {
    sVar4 = Span<const_char>::size((Span<const_char> *)&out_local);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,sVar4 >> 1);
    for (uStack_30 = 0;
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this),
        uStack_30 < sVar5; uStack_30 = uStack_30 + 1) {
      pcVar6 = Span<const_char>::operator[]((Span<const_char> *)&out_local,uStack_30 << 1);
      cVar1 = *pcVar6;
      pcVar6 = Span<const_char>::operator[]((Span<const_char> *)&out_local,uStack_30 * 2 + 1);
      cVar2 = *pcVar6;
      if ((cVar1 < '0') || ('9' < cVar1)) {
        if ((cVar1 < 'a') || ('f' < cVar1)) {
          return false;
        }
        local_33 = cVar1 + -0x57;
      }
      else {
        local_33 = cVar1 + -0x30;
      }
      if ((cVar2 < '0') || ('9' < cVar2)) {
        if ((cVar2 < 'a') || ('f' < cVar2)) {
          return false;
        }
        bVar3 = cVar2 + 0xa9;
      }
      else {
        bVar3 = cVar2 - 0x30;
      }
      local_33 = local_33 << 4 | bVar3;
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,uStack_30);
      *pbVar7 = local_33;
    }
    in_local.size_._7_1_ = true;
  }
  else {
    in_local.size_._7_1_ = false;
  }
  return in_local.size_._7_1_;
}

Assistant:

static bool DecodeLowerHex(std::vector<uint8_t> *out,
                           bssl::Span<const char> in) {
  if (in.size() % 2 != 0) {
    return false;
  }
  out->resize(in.size() / 2);
  for (size_t i = 0; i < out->size(); i++) {
    char hi = in[2 * i], lo = in[2 * i + 1];
    uint8_t b = 0;
    if ('0' <= hi && hi <= '9') {
      b |= hi - '0';
    } else if ('a' <= hi && hi <= 'f') {
      b |= hi - 'a' + 10;
    } else {
      return false;
    }
    b <<= 4;
    if ('0' <= lo && lo <= '9') {
      b |= lo - '0';
    } else if ('a' <= lo && lo <= 'f') {
      b |= lo - 'a' + 10;
    } else {
      return false;
    }
    (*out)[i] = b;
  }
  return true;
}